

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix4 * matrix4_view_lookat_rh_EXP(matrix4 *self,vector3 *eye,vector3 *target,vector3 *up)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar2 = (target->field_0).v[0] - (eye->field_0).v[0];
  fVar6 = (target->field_0).v[1] - (eye->field_0).v[1];
  fVar5 = (target->field_0).v[2] - (eye->field_0).v[2];
  fVar1 = fVar5 * fVar5 + fVar2 * fVar2 + fVar6 * fVar6;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar7 = -fVar1;
  if (-fVar1 <= fVar1) {
    fVar7 = fVar1;
  }
  if (1e-05 <= fVar7) {
    fVar6 = fVar6 / fVar1;
    fVar5 = fVar5 / fVar1;
  }
  fVar7 = (float)(~-(uint)(1e-05 <= fVar7) & (uint)fVar2 |
                 (uint)(fVar2 / fVar1) & -(uint)(1e-05 <= fVar7));
  fVar2 = fVar6 * (up->field_0).v[2] - (up->field_0).v[1] * fVar5;
  fVar9 = fVar5 * (up->field_0).v[0] - (up->field_0).v[2] * fVar7;
  fVar8 = fVar7 * (up->field_0).v[1] - (up->field_0).v[0] * fVar6;
  fVar1 = fVar8 * fVar8 + fVar2 * fVar2 + fVar9 * fVar9;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar3 = -fVar1;
  if (-fVar1 <= fVar1) {
    fVar3 = fVar1;
  }
  if (1e-05 <= fVar3) {
    fVar9 = fVar9 / fVar1;
    fVar8 = fVar8 / fVar1;
  }
  fVar2 = (float)(~-(uint)(1e-05 <= fVar3) & (uint)fVar2 |
                 (uint)(fVar2 / fVar1) & -(uint)(1e-05 <= fVar3));
  fVar1 = fVar9 * fVar5 - fVar6 * fVar8;
  fVar4 = fVar8 * fVar7 - fVar5 * fVar2;
  fVar3 = fVar2 * fVar6 - fVar7 * fVar9;
  *(undefined8 *)((long)&self->field_0 + 4) = 0;
  *(undefined8 *)((long)&self->field_0 + 0xc) = 0;
  *(undefined8 *)((long)&self->field_0 + 0x18) = 0;
  *(undefined8 *)((long)&self->field_0 + 0x20) = 0;
  *(undefined8 *)((long)&self->field_0 + 0x2c) = 0;
  *(undefined8 *)((long)&self->field_0 + 0x34) = 0;
  (self->field_0).m[0xf] = 1.0;
  (self->field_0).m[0] = fVar2;
  (self->field_0).m[1] = fVar9;
  (self->field_0).m[2] = fVar8;
  (self->field_0).m[4] = fVar1;
  (self->field_0).m[5] = fVar4;
  (self->field_0).m[6] = fVar3;
  (self->field_0).m[8] = -fVar7;
  (self->field_0).m[9] = -fVar6;
  (self->field_0).m[10] = -fVar5;
  (self->field_0).m[3] =
       -(fVar8 * (eye->field_0).v[2] + (eye->field_0).v[0] * fVar2 + fVar9 * (eye->field_0).v[1]);
  (self->field_0).m[7] =
       -(fVar3 * (eye->field_0).v[2] + fVar1 * (eye->field_0).v[0] + fVar4 * (eye->field_0).v[1]);
  (self->field_0).m[0xb] =
       -(fVar5 * (eye->field_0).v[2] + (eye->field_0).v[0] * fVar7 + fVar6 * (eye->field_0).v[1]);
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_view_lookat_rh_EXP(struct matrix4 *self, const struct vector3 *eye, const struct vector3 *target, const struct vector3 *up)
{
	struct vector3 yaxis;
	struct vector3 zaxis;
	struct vector3 xaxis;

	zaxis.x = target->x - eye->x;
	zaxis.y = target->y - eye->y;
	zaxis.z = target->z - eye->z;
	vector3_normalize(&zaxis);

	/* xaxis = zaxis x up */
	vector3_cross_product(&xaxis, &zaxis, up);
	vector3_normalize(&xaxis);

	/* yaxis = xaxis x zaxis */
	vector3_cross_product(&yaxis, &xaxis, &zaxis);

	matrix4_identity(self);

	self->c00 = xaxis.x;
	self->c10 = xaxis.y;
	self->c20 = xaxis.z;

	self->c01 = yaxis.x;
	self->c11 = yaxis.y;
	self->c21 = yaxis.z;

	self->c02 = -zaxis.x;
	self->c12 = -zaxis.y;
	self->c22 = -zaxis.z;

	self->c30 = -vector3_dot_product(&xaxis, eye);
	self->c31 = -vector3_dot_product(&yaxis, eye);
	self->c32 = -vector3_dot_product(&zaxis, eye);

	return self;
}